

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

int __thiscall util::log::logger::rotate_by_lines(logger *this,sinker_internal *sinker)

{
  pointer pcVar1;
  char cVar2;
  long *plVar3;
  long *plVar4;
  int iVar5;
  string new_file_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  time_t now;
  tm vtm;
  char string1 [128];
  long *local_128;
  long local_118;
  long lStack_110;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  time_t local_e8;
  tm local_e0;
  char local_a8 [136];
  
  iVar5 = 0;
  if ((sinker->sk).lines <= sinker->cur_line) {
    std::ofstream::close();
    local_e8 = time((time_t *)0x0);
    local_a8[0x70] = '\0';
    local_a8[0x71] = '\0';
    local_a8[0x72] = '\0';
    local_a8[0x73] = '\0';
    local_a8[0x74] = '\0';
    local_a8[0x75] = '\0';
    local_a8[0x76] = '\0';
    local_a8[0x77] = '\0';
    local_a8[0x78] = '\0';
    local_a8[0x79] = '\0';
    local_a8[0x7a] = '\0';
    local_a8[0x7b] = '\0';
    local_a8[0x7c] = '\0';
    local_a8[0x7d] = '\0';
    local_a8[0x7e] = '\0';
    local_a8[0x7f] = '\0';
    local_a8[0x60] = '\0';
    local_a8[0x61] = '\0';
    local_a8[0x62] = '\0';
    local_a8[99] = '\0';
    local_a8[100] = '\0';
    local_a8[0x65] = '\0';
    local_a8[0x66] = '\0';
    local_a8[0x67] = '\0';
    local_a8[0x68] = '\0';
    local_a8[0x69] = '\0';
    local_a8[0x6a] = '\0';
    local_a8[0x6b] = '\0';
    local_a8[0x6c] = '\0';
    local_a8[0x6d] = '\0';
    local_a8[0x6e] = '\0';
    local_a8[0x6f] = '\0';
    local_a8[0x50] = '\0';
    local_a8[0x51] = '\0';
    local_a8[0x52] = '\0';
    local_a8[0x53] = '\0';
    local_a8[0x54] = '\0';
    local_a8[0x55] = '\0';
    local_a8[0x56] = '\0';
    local_a8[0x57] = '\0';
    local_a8[0x58] = '\0';
    local_a8[0x59] = '\0';
    local_a8[0x5a] = '\0';
    local_a8[0x5b] = '\0';
    local_a8[0x5c] = '\0';
    local_a8[0x5d] = '\0';
    local_a8[0x5e] = '\0';
    local_a8[0x5f] = '\0';
    local_a8[0x40] = '\0';
    local_a8[0x41] = '\0';
    local_a8[0x42] = '\0';
    local_a8[0x43] = '\0';
    local_a8[0x44] = '\0';
    local_a8[0x45] = '\0';
    local_a8[0x46] = '\0';
    local_a8[0x47] = '\0';
    local_a8[0x48] = '\0';
    local_a8[0x49] = '\0';
    local_a8[0x4a] = '\0';
    local_a8[0x4b] = '\0';
    local_a8[0x4c] = '\0';
    local_a8[0x4d] = '\0';
    local_a8[0x4e] = '\0';
    local_a8[0x4f] = '\0';
    local_a8[0x30] = '\0';
    local_a8[0x31] = '\0';
    local_a8[0x32] = '\0';
    local_a8[0x33] = '\0';
    local_a8[0x34] = '\0';
    local_a8[0x35] = '\0';
    local_a8[0x36] = '\0';
    local_a8[0x37] = '\0';
    local_a8[0x38] = '\0';
    local_a8[0x39] = '\0';
    local_a8[0x3a] = '\0';
    local_a8[0x3b] = '\0';
    local_a8[0x3c] = '\0';
    local_a8[0x3d] = '\0';
    local_a8[0x3e] = '\0';
    local_a8[0x3f] = '\0';
    local_a8[0x20] = '\0';
    local_a8[0x21] = '\0';
    local_a8[0x22] = '\0';
    local_a8[0x23] = '\0';
    local_a8[0x24] = '\0';
    local_a8[0x25] = '\0';
    local_a8[0x26] = '\0';
    local_a8[0x27] = '\0';
    local_a8[0x28] = '\0';
    local_a8[0x29] = '\0';
    local_a8[0x2a] = '\0';
    local_a8[0x2b] = '\0';
    local_a8[0x2c] = '\0';
    local_a8[0x2d] = '\0';
    local_a8[0x2e] = '\0';
    local_a8[0x2f] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = '\0';
    local_a8[0x19] = '\0';
    local_a8[0x1a] = '\0';
    local_a8[0x1b] = '\0';
    local_a8[0x1c] = '\0';
    local_a8[0x1d] = '\0';
    local_a8[0x1e] = '\0';
    local_a8[0x1f] = '\0';
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = '\0';
    local_a8[9] = '\0';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    localtime_r(&local_e8,&local_e0);
    strftime(local_a8,0x80,"%Y%m%d%H%M%S",&local_e0);
    pcVar1 = (sinker->sk).log_file._M_dataplus._M_p;
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_108,pcVar1,pcVar1 + (sinker->sk).log_file._M_string_length);
    std::__cxx11::string::append((char *)local_108);
    plVar3 = (long *)std::__cxx11::string::append((char *)local_108);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_118 = *plVar4;
      lStack_110 = plVar3[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar4;
      local_128 = (long *)*plVar3;
    }
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_108[0] != local_f8) {
      operator_delete(local_108[0]);
    }
    rename((sinker->sk).log_file._M_dataplus._M_p,(char *)local_128);
    std::ofstream::open((char *)sinker->m_ofs,(_Ios_Openmode)(sinker->sk).log_file._M_dataplus._M_p)
    ;
    cVar2 = std::__basic_file<char>::is_open();
    iVar5 = -1;
    if (cVar2 != '\0') {
      sinker->cur_line = 0;
      iVar5 = 0;
    }
    if (local_128 != &local_118) {
      operator_delete(local_128);
    }
  }
  return iVar5;
}

Assistant:

int logger::rotate_by_lines(sinker_internal & sinker) {
            if (sinker.cur_line < sinker.sk.lines) {
                return 0;
            }

            //1.close old log file
            sinker.m_ofs->close();

            //2.rename old log
            struct tm vtm;
            time_t now = time(0);
            char string1[128] = {0};
            localtime_r(&(now), &vtm);
            strftime(string1, 128, "%Y%m%d%H%M%S", &vtm);
            string new_file_name = sinker.sk.log_file + "." + string1;
#ifdef USE_BOOST
            rename(path(sinker.sk.log_file), path(new_file_name));
#else
            rename(sinker.sk.log_file.c_str(), new_file_name.c_str());
#endif
            //3.open new log file
            sinker.m_ofs->open(sinker.sk.log_file.c_str(), ios_base::out | ios_base::app);
            if (!sinker.m_ofs->is_open()) {
                return -1;
            }
            sinker.cur_line = 0;

            return 0;
        }